

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void HalfMergeUVRow_SSSE3
               (uint8_t *src_u,int src_stride_u,uint8_t *src_v,int src_stride_v,uint8_t *dst_uv,
               int width)

{
  bool bVar1;
  undefined1 *puVar2;
  int iVar3;
  short sVar4;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar5 [16];
  short sVar12;
  short sVar13;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar14 [16];
  short sVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  do {
    auVar14 = *(undefined1 (*) [16])src_u;
    puVar2 = *(undefined1 (*) [16])src_u;
    src_u = (uint8_t *)((long)src_u + 0x10);
    auVar5[8] = 1;
    auVar5._0_8_ = 0x101010101010101;
    auVar5[9] = 1;
    auVar5[10] = 1;
    auVar5[0xb] = 1;
    auVar5[0xc] = 1;
    auVar5[0xd] = 1;
    auVar5[0xe] = 1;
    auVar5[0xf] = 1;
    auVar5 = pmaddubsw(auVar14,auVar5);
    auVar14[8] = 1;
    auVar14._0_8_ = 0x101010101010101;
    auVar14[9] = 1;
    auVar14[10] = 1;
    auVar14[0xb] = 1;
    auVar14[0xc] = 1;
    auVar14[0xd] = 1;
    auVar14[0xe] = 1;
    auVar14[0xf] = 1;
    auVar14 = pmaddubsw(*(undefined1 (*) [16])src_v,auVar14);
    auVar22[8] = 1;
    auVar22._0_8_ = 0x101010101010101;
    auVar22[9] = 1;
    auVar22[10] = 1;
    auVar22[0xb] = 1;
    auVar22[0xc] = 1;
    auVar22[0xd] = 1;
    auVar22[0xe] = 1;
    auVar22[0xf] = 1;
    auVar22 = pmaddubsw(*(undefined1 (*) [16])(puVar2 + src_stride_u),auVar22);
    auVar23[8] = 1;
    auVar23._0_8_ = 0x101010101010101;
    auVar23[9] = 1;
    auVar23[10] = 1;
    auVar23[0xb] = 1;
    auVar23[0xc] = 1;
    auVar23[0xd] = 1;
    auVar23[0xe] = 1;
    auVar23[0xf] = 1;
    auVar23 = pmaddubsw(*(undefined1 (*) [16])(*(undefined1 (*) [16])src_v + src_stride_v),auVar23);
    src_v = (uint8_t *)((long)src_v + 0x10);
    sVar4 = pavgw((ushort)(auVar5._0_2_ + auVar22._0_2_) >> 1,0);
    sVar6 = pavgw((ushort)(auVar5._2_2_ + auVar22._2_2_) >> 1,0);
    sVar7 = pavgw((ushort)(auVar5._4_2_ + auVar22._4_2_) >> 1,0);
    sVar8 = pavgw((ushort)(auVar5._6_2_ + auVar22._6_2_) >> 1,0);
    sVar9 = pavgw((ushort)(auVar5._8_2_ + auVar22._8_2_) >> 1,0);
    sVar10 = pavgw((ushort)(auVar5._10_2_ + auVar22._10_2_) >> 1,0);
    sVar11 = pavgw((ushort)(auVar5._12_2_ + auVar22._12_2_) >> 1,0);
    sVar12 = pavgw((ushort)(auVar5._14_2_ + auVar22._14_2_) >> 1,0);
    sVar13 = pavgw((ushort)(auVar14._0_2_ + auVar23._0_2_) >> 1,0);
    sVar15 = pavgw((ushort)(auVar14._2_2_ + auVar23._2_2_) >> 1,0);
    sVar16 = pavgw((ushort)(auVar14._4_2_ + auVar23._4_2_) >> 1,0);
    sVar17 = pavgw((ushort)(auVar14._6_2_ + auVar23._6_2_) >> 1,0);
    sVar18 = pavgw((ushort)(auVar14._8_2_ + auVar23._8_2_) >> 1,0);
    sVar19 = pavgw((ushort)(auVar14._10_2_ + auVar23._10_2_) >> 1,0);
    sVar20 = pavgw((ushort)(auVar14._12_2_ + auVar23._12_2_) >> 1,0);
    sVar21 = pavgw((ushort)(auVar14._14_2_ + auVar23._14_2_) >> 1,0);
    *dst_uv = (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4);
    dst_uv[1] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    dst_uv[2] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
    dst_uv[3] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    dst_uv[4] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    dst_uv[5] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    dst_uv[6] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    dst_uv[7] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    dst_uv[8] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    dst_uv[9] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    dst_uv[10] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    dst_uv[0xb] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    dst_uv[0xc] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    dst_uv[0xd] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    dst_uv[0xe] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    dst_uv[0xf] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    dst_uv = dst_uv + 0x10;
    iVar3 = width + -0x10;
    bVar1 = 0xf < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar1);
  return;
}

Assistant:

void HalfMergeUVRow_SSSE3(const uint8_t* src_u,
                          int src_stride_u,
                          const uint8_t* src_v,
                          int src_stride_v,
                          uint8_t* dst_uv,
                          int width) {
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrlw       $0xf,%%xmm4                   \n"
      "packuswb    %%xmm4,%%xmm4                 \n"
      "pxor        %%xmm5,%%xmm5                 \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"  // load 16 U values
      "movdqu      (%1),%%xmm1                   \n"  // load 16 V values
      "movdqu      0(%0,%4,1),%%xmm2             \n"  // 16 from next row
      "movdqu      0(%1,%5,1),%%xmm3             \n"
      "lea         0x10(%0),%0                   \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"  // half size
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pmaddubsw   %%xmm4,%%xmm2                 \n"
      "pmaddubsw   %%xmm4,%%xmm3                 \n"
      "lea         0x10(%1),%1                   \n"
      "paddw       %%xmm2,%%xmm0                 \n"
      "paddw       %%xmm3,%%xmm1                 \n"
      "psrlw       $0x1,%%xmm0                   \n"
      "psrlw       $0x1,%%xmm1                   \n"
      "pavgw       %%xmm5,%%xmm0                 \n"
      "pavgw       %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "packuswb    %%xmm1,%%xmm1                 \n"
      "punpcklbw   %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%2)                   \n"  // store 8 UV pixels
      "lea         0x10(%2),%2                   \n"
      "sub         $0x10,%3                      \n"  // 16 src pixels per loop
      "jg          1b                            \n"
      : "+r"(src_u),                    // %0
        "+r"(src_v),                    // %1
        "+r"(dst_uv),                   // %2
        "+r"(width)                     // %3
      : "r"((intptr_t)(src_stride_u)),  // %4
        "r"((intptr_t)(src_stride_v))   // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5");
}